

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.h
# Opt level: O2

strong_ordering QCborArray::compareThreeWay_helper(QCborArray *lhs,QCborValue *rhs)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0xffffffc0;
  if (rhs->t < DateTime) {
    uVar2 = (ulong)(uint)(0x80 - rhs->t);
  }
  if ((int)uVar2 == 0) {
    uVar1 = compareContainer((lhs->d).d.ptr,rhs->container,ForOrdering);
    uVar2 = (ulong)uVar1;
  }
  uVar3 = (ulong)(byte)((char)(uVar2 >> 0x18) >> 7 | 1);
  if ((int)uVar2 == 0) {
    uVar3 = uVar2;
  }
  return (strong_ordering)(CompareUnderlyingType)uVar3;
}

Assistant:

Type type() const           { return t; }